

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

void gen_windowed_sines(int freq_count,double *freqs,double max,float *output,int output_len)

{
  float fVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  
  uVar2 = 0;
  uVar5 = 0;
  if (0 < output_len) {
    uVar5 = (ulong)(uint)output_len;
  }
  for (; uVar5 != uVar2; uVar2 = uVar2 + 1) {
    output[uVar2] = 0.0;
  }
  uVar4 = 0;
  uVar2 = (ulong)(uint)freq_count;
  if (freq_count < 1) {
    uVar2 = uVar4;
  }
  while( true ) {
    if (uVar4 == uVar2) {
      for (lVar3 = 0; uVar5 * 2 != lVar3; lVar3 = lVar3 + 2) {
        fVar1 = *(float *)((long)output + lVar3 * 2);
        dVar6 = cos(((double)(int)lVar3 * 3.141592653589793) / (double)(output_len + -1));
        *(float *)((long)output + lVar3 * 2) = (float)((dVar6 * -0.5 + 0.5) * (double)fVar1);
      }
      return;
    }
    if ((freqs[uVar4] <= 0.0) || (0.5 <= freqs[uVar4])) break;
    for (lVar3 = 0; uVar5 * 2 != lVar3; lVar3 = lVar3 + 2) {
      fVar1 = *(float *)((long)output + lVar3 * 2);
      dVar6 = sin((double)(int)lVar3 * freqs[uVar4] * 3.141592653589793 +
                  2.827433388230814 / (double)freq_count);
      *(float *)((long)output + lVar3 * 2) =
           (float)(dVar6 * (max / (double)freq_count) + (double)fVar1);
    }
    uVar4 = uVar4 + 1;
  }
  printf("\n%s : Error : freq [%d] == %g is out of range. Should be < 0.5.\n",
         "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/tests/util.c"
         ,uVar4 & 0xffffffff);
  exit(1);
}

Assistant:

void
gen_windowed_sines (int freq_count, const double *freqs, double max, float *output, int output_len)
{	int 	k, freq ;
	double	amplitude, phase ;

	amplitude = max / freq_count ;

	for (k = 0 ; k < output_len ; k++)
		output [k] = 0.0 ;

	for (freq = 0 ; freq < freq_count ; freq++)
	{	phase = 0.9 * M_PI / freq_count ;

		if (freqs [freq] <= 0.0 || freqs [freq] >= 0.5)
		{	printf ("\n%s : Error : freq [%d] == %g is out of range. Should be < 0.5.\n", __FILE__, freq, freqs [freq]) ;
			exit (1) ;
			} ;

		for (k = 0 ; k < output_len ; k++)
			output [k] = (float) (output [k] + (amplitude * sin (freqs [freq] * (2 * k) * M_PI + phase))) ;
		} ;

	/* Apply Hanning Window. */
	for (k = 0 ; k < output_len ; k++)
		output [k] = (float) (output [k] * (0.5 - 0.5 * cos ((2 * k) * M_PI / (output_len - 1)))) ;

	/*	data [k] *= 0.3635819 - 0.4891775 * cos ((2 * k) * M_PI / (output_len - 1))
					+ 0.1365995 * cos ((4 * k) * M_PI / (output_len - 1))
					- 0.0106411 * cos ((6 * k) * M_PI / (output_len - 1)) ;
		*/

	return ;
}